

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O1

uint16_t __thiscall level_tools::get_sector_idx(level_tools *this,fvector3 *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer ppsVar5;
  pointer ppxVar6;
  xr_ogf *pxVar7;
  uint16_t uVar8;
  pointer ppsVar9;
  uint16_t uVar10;
  float fVar11;
  float fVar12;
  
  ppsVar9 = (this->m_sectors->
            super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppsVar5 = (this->m_sectors->
            super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar9 == ppsVar5) {
    uVar8 = 0xffff;
  }
  else {
    ppxVar6 = (this->m_subdivisions->
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    fVar1 = (p->field_0).field_0.x;
    fVar2 = (p->field_0).field_0.y;
    fVar3 = (p->field_0).field_0.z;
    fVar11 = 3.4028235e+38;
    uVar8 = 0xffff;
    uVar10 = 0;
    do {
      if ((ulong)((long)(this->m_subdivisions->
                        super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar6 >> 3) <=
          (ulong)(*ppsVar9)->root) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pxVar7 = ppxVar6[(*ppsVar9)->root];
      fVar12 = (pxVar7->m_bbox).field_0.field_1.x1;
      if ((((fVar12 <= fVar1) && (fVar4 = (pxVar7->m_bbox).field_0.field_1.x2, fVar1 <= fVar4)) &&
          ((pxVar7->m_bbox).field_0.field_1.y1 <= fVar2)) &&
         (((fVar2 <= (pxVar7->m_bbox).field_0.field_1.y2 &&
           ((pxVar7->m_bbox).field_0.field_1.z1 <= fVar3)) &&
          ((fVar3 <= (pxVar7->m_bbox).field_0.field_1.z2 &&
           (fVar12 = ((pxVar7->m_bbox).field_0.field_1.z2 - (pxVar7->m_bbox).field_0.field_1.z1) +
                     ((pxVar7->m_bbox).field_0.field_1.y2 - (pxVar7->m_bbox).field_0.field_1.y1) +
                     (fVar4 - fVar12), fVar12 < fVar11)))))) {
        fVar11 = fVar12;
        uVar8 = uVar10;
      }
      ppsVar9 = ppsVar9 + 1;
      uVar10 = uVar10 + 1;
    } while (ppsVar9 != ppsVar5);
  }
  if (uVar8 == 0xffff) {
    __assert_fail("sector_idx != (65535)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sectors.cxx"
                  ,0x59,"uint16_t level_tools::get_sector_idx(const fvector3 &) const");
  }
  return uVar8;
}

Assistant:

uint16_t level_tools::get_sector_idx(const fvector3& p) const
{
	uint16_t sector_idx = UINT16_MAX;
	float size, min_size = xr_numeric_limits<float>::max();
	for (sector_data_vec_cit it0 = m_sectors->begin(), it = it0, end = m_sectors->end();
			it != end; ++it) {
		const fbox& aabb = m_subdivisions->at((*it)->root)->bbox();
		if (aabb.contain(p) && min_size > (size = aabb.size())) {
			min_size = size;
			sector_idx = uint16_t((it - it0) & UINT16_MAX);
		}
	}
	xr_assert(sector_idx != UINT16_MAX);
	return sector_idx;
}